

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prng_read(prng *pr,void *vout,size_t size)

{
  prng_impl *local_c0;
  size_t to_use;
  uint8_t *out;
  uchar buf [114];
  prng_impl *pi;
  size_t size_local;
  void *vout_local;
  prng *pr_local;
  
  to_use = (size_t)vout;
  pi = (prng_impl *)size;
  if (pr[2].savesize != 0) {
    __assert_fail("!pi->keymaker",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xdd,"void prng_read(prng *, void *, size_t)");
  }
  for (; pi != (prng_impl *)0x0; pi = (prng_impl *)((long)pi - (long)local_c0)) {
    prng_generate((prng_impl *)pr,&out);
    if (*(prng_impl **)(pr[1].savesize + 0x28) < pi) {
      local_c0 = *(prng_impl **)(pr[1].savesize + 0x28);
    }
    else {
      local_c0 = pi;
    }
    memcpy((void *)to_use,&out,(size_t)local_c0);
    to_use = (long)(local_c0->Prng).binarysink_ + (to_use - 8);
  }
  smemclr(&out,0x72);
  prng_seed_begin(pr);
  prng_seed_finish(pr);
  return;
}

Assistant:

void prng_read(prng *pr, void *vout, size_t size)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);
    unsigned char buf[MAX_HASH_LEN];

    assert(!pi->keymaker);

    prngdebug("prng_read %"SIZEu"\n", size);

    uint8_t *out = (uint8_t *)vout;
    while (size > 0) {
        prng_generate(pi, buf);
        size_t to_use = size > pi->hashalg->hlen ? pi->hashalg->hlen : size;
        memcpy(out, buf, to_use);
        out += to_use;
        size -= to_use;
    }

    smemclr(buf, sizeof(buf));

    prng_seed_begin(&pi->Prng);
    prng_seed_finish(&pi->Prng);
}